

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

bool anon_unknown.dwarf_daf5::StrEqVerbose(string *a,string *b,string *text)

{
  bool bVar1;
  
  bVar1 = std::operator!=(a,b);
  if (bVar1) {
    printf("EXPECTED: %s\n",(a->_M_dataplus)._M_p);
    printf("ACTUAL: %s\n",(b->_M_dataplus)._M_p);
    printf("TEXT: %s\n",(text->_M_dataplus)._M_p);
  }
  return !bVar1;
}

Assistant:

bool StrEqVerbose(const string& a, const string& b,
                         const string& text) {
  if (a != b) {
    printf("EXPECTED: %s\n", a.c_str());
    printf("ACTUAL: %s\n", b.c_str());
    printf("TEXT: %s\n", text.c_str());
    return false;
  }
  return true;
}